

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPathMatcher.cpp
# Opt level: O2

uchar __thiscall xercesc_4_0::XPathMatcher::isMatched(XPathMatcher *this)

{
  byte bVar1;
  XMLSize_t i;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if (this->fLocationPathSize <= uVar2) {
      return '\0';
    }
    bVar1 = this->fMatched[uVar2];
    uVar2 = uVar2 + 1;
  } while ((~bVar1 & 0xd) == 0 || (bVar1 & 1) == 0);
  return bVar1;
}

Assistant:

unsigned char XPathMatcher::isMatched() {

    // xpath has been matched if any one of the members of the union have matched.
    for (XMLSize_t i=0; i < fLocationPathSize; i++) {
        if (((fMatched[i] & XP_MATCHED) == XP_MATCHED)
            && ((fMatched[i] & XP_MATCHED_DP) != XP_MATCHED_DP))
            return fMatched[i];
    }

    return 0;
}